

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  undefined1 auVar11 [16];
  unkbyte10 Var12;
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int16_t iVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  undefined8 unaff_RBX;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  undefined4 uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 uVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar41;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ushort uVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  undefined4 uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short sVar70;
  undefined1 auVar71 [16];
  short sVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint local_1d0;
  short local_1b8;
  short sStack_1b6;
  undefined1 local_178 [16];
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  undefined1 local_118 [16];
  ushort local_108;
  ushort uStack_106;
  undefined8 local_a8;
  ulong uStack_a0;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse2_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse2_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse2_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse2_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse2_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse2_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse2_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar24 = -open;
    iVar21 = matrix->min;
    iVar17 = -iVar21;
    if (iVar21 != iVar24 && SBORROW4(iVar21,iVar24) == iVar21 + open < 0) {
      iVar17 = open;
    }
    iVar21 = matrix->max;
    ppVar18 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar18 != (parasail_result_t *)0x0) {
      ppVar18->flag = ppVar18->flag | 0x8221001;
      uVar22 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar22);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar22);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar22);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar14 = _s1Len + 7;
          ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar14);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar2 = matrix->mapper;
            uVar22 = 0;
            do {
              ptr_02[uVar22] = (int16_t)piVar2[(byte)_s1[uVar22]];
              uVar22 = uVar22 + 1;
            } while ((uint)_s1Len != uVar22);
          }
          iVar10 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < iVar14) {
            iVar10 = iVar14;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar10) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        auVar37 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar21));
        uVar26 = s2Len + 7;
        local_1d0 = _s1Len - 1;
        iVar21 = s2Len + -1;
        uVar28 = iVar17 - 0x7fff;
        auVar64 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
        uVar63 = auVar64._0_4_;
        local_1b8 = auVar64._0_2_;
        sStack_1b6 = auVar64._2_2_;
        auVar37 = pshuflw(auVar37,auVar37,0);
        auVar64._0_4_ = auVar37._0_4_;
        auVar64._4_4_ = auVar64._0_4_;
        auVar64._8_4_ = auVar64._0_4_;
        auVar64._12_4_ = auVar64._0_4_;
        auVar64 = pshuflw(auVar64,ZEXT416((uint)open),0);
        uVar35 = auVar64._0_4_;
        auVar64 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        auVar38._0_4_ = auVar64._0_4_;
        auVar38._4_4_ = auVar38._0_4_;
        auVar38._8_4_ = auVar38._0_4_;
        auVar38._12_4_ = auVar38._0_4_;
        auVar64 = psllw(auVar38,3);
        auVar39 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
        uVar36 = auVar39._0_4_;
        auVar42._4_4_ = uVar36;
        auVar42._0_4_ = uVar36;
        auVar42._8_4_ = uVar36;
        auVar42._12_4_ = uVar36;
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar42 = paddsw(auVar42,auVar39);
        auVar43 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        auVar43._4_4_ = auVar43._0_4_;
        auVar43._8_4_ = auVar43._0_4_;
        auVar43._12_4_ = auVar43._0_4_;
        auVar39 = paddsw(auVar43,auVar39);
        local_178._6_2_ = (short)(iVar24 + gap * -4);
        local_178._4_2_ = (short)(gap * 0xfffb - open);
        local_178._2_2_ = (short)(gap * 0xfffa - open);
        local_178._0_2_ = (short)(gap * 0xfff9 - open);
        local_178._10_2_ = (short)(iVar24 + gap * -2);
        local_178._8_2_ = (short)(gap * 0xfffd - open);
        sVar54 = (short)iVar24;
        local_178._14_2_ = sVar54;
        local_178._12_2_ = (short)(iVar24 - gap);
        piVar2 = matrix->mapper;
        uVar34 = (ulong)(uint)s2Len;
        uVar22 = 0;
        do {
          ptr[uVar22 + 7] = (int16_t)piVar2[(byte)_s2[uVar22]];
          uVar22 = uVar22 + 1;
        } while (uVar34 != uVar22);
        uVar22 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar15 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar26) {
          uVar15 = uVar26;
        }
        memset(ptr + uVar34 + 7,0,(ulong)(~s2Len + uVar15) * 2 + 2);
        do {
          ptr_00[uVar22 + 7] = (int16_t)iVar24;
          iVar24 = iVar24 - gap;
          iVar23 = (int16_t)uVar28;
          ptr_01[uVar22 + 7] = iVar23;
          uVar22 = uVar22 + 1;
        } while (uVar34 != uVar22);
        lVar19 = 0;
        do {
          ptr_00[lVar19] = iVar23;
          ptr_01[lVar19] = iVar23;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 7);
        lVar19 = uVar34 + 7;
        do {
          ptr_00[lVar19] = iVar23;
          ptr_01[lVar19] = iVar23;
          lVar19 = lVar19 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar26);
        ptr_00[6] = 0;
        local_108 = auVar37._0_2_;
        uStack_106 = auVar37._2_2_;
        uVar55 = local_108;
        uVar56 = uStack_106;
        uVar57 = local_108;
        uVar58 = uStack_106;
        uVar59 = local_108;
        uVar60 = uStack_106;
        uVar61 = local_108;
        uVar62 = uStack_106;
        if (_s1Len < 1) {
          auVar37._4_2_ = local_1b8;
          auVar37._0_4_ = uVar63;
          auVar37._6_2_ = sStack_1b6;
          auVar37._8_2_ = local_1b8;
          auVar37._10_2_ = sStack_1b6;
          auVar37._12_2_ = local_1b8;
          auVar37._14_2_ = sStack_1b6;
          local_118 = auVar37;
        }
        else {
          piVar2 = matrix->matrix;
          Var12 = CONCAT28(local_1b8,CONCAT26(sStack_1b6,CONCAT24(local_1b8,uVar63)));
          auVar11._10_2_ = sStack_1b6;
          auVar11._0_10_ = Var12;
          auVar11._12_2_ = local_1b8;
          auVar11._14_2_ = sStack_1b6;
          uVar22 = 1;
          if (1 < (int)uVar26) {
            uVar22 = (ulong)uVar26;
          }
          uVar25 = (ulong)(uint)_s1Len;
          local_128 = uVar34 * 0x1c + -0x1c;
          lVar19 = uVar34 * 0x20;
          local_130 = uVar34 * 4 + -4;
          local_140 = uVar34 * 0x18 + -0x18;
          local_148 = uVar34 * 0x14 + -0x14;
          local_150 = uVar34 * 8 + -8;
          local_158 = uVar34 * 0x10 + -0x10;
          local_160 = uVar34 * 0xc + -0xc;
          local_138 = 0;
          uVar32 = 0;
          auVar37 = auVar11;
          auVar43 = _DAT_00904ad0;
          local_118 = auVar11;
          do {
            if (matrix->type == 0) {
              uVar26 = (uint)ptr_02[uVar32];
              uVar20 = (uint)ptr_02[uVar32 + 1];
              uVar16 = (uint)ptr_02[uVar32 + 2];
              uVar30 = (uint)ptr_02[uVar32 + 3];
              uVar29 = (uint)ptr_02[uVar32 + 4];
              uVar33 = (uint)ptr_02[uVar32 + 5];
              uVar31 = (uint)ptr_02[uVar32 + 6];
              uVar15 = (int)ptr_02[uVar32 + 7];
            }
            else {
              uVar26 = (uint)uVar32;
              uVar20 = uVar26 | 1;
              if (uVar25 <= (uVar32 | 1)) {
                uVar20 = local_1d0;
              }
              uVar16 = uVar26 | 2;
              if (uVar25 <= (uVar32 | 2)) {
                uVar16 = local_1d0;
              }
              uVar30 = uVar26 | 3;
              if (uVar25 <= (uVar32 | 3)) {
                uVar30 = local_1d0;
              }
              uVar29 = uVar26 | 4;
              if (uVar25 <= (uVar32 | 4)) {
                uVar29 = local_1d0;
              }
              uVar33 = uVar26 | 5;
              if (uVar25 <= (uVar32 | 5)) {
                uVar33 = local_1d0;
              }
              uVar31 = uVar26 | 6;
              if (uVar25 <= (uVar32 | 6)) {
                uVar31 = local_1d0;
              }
              uVar15 = uVar26 | 7;
              if (uVar25 <= (uVar32 | 7)) {
                uVar15 = local_1d0;
              }
            }
            iVar17 = matrix->size;
            uVar1 = uVar32 + 8;
            local_a8 = (undefined8)((unkuint10)Var12 >> 0x10);
            uStack_a0 = auVar11._8_8_ >> 0x10;
            auVar65._8_8_ = uStack_a0 | (ulong)(ushort)ptr_00[6] << 0x30;
            auVar65._0_8_ = local_a8;
            auVar67._8_8_ = uStack_a0 | (ulong)(ushort)(sVar54 - (short)uVar32 * (short)gap) << 0x30
            ;
            auVar67._0_8_ = local_a8;
            ptr_00[6] = sVar54 - (short)uVar1 * (short)gap;
            local_98 = auVar42._0_2_;
            sStack_96 = auVar42._2_2_;
            sStack_94 = auVar42._4_2_;
            sStack_92 = auVar42._6_2_;
            sStack_90 = auVar42._8_2_;
            sStack_8e = auVar42._10_2_;
            sStack_8c = auVar42._12_2_;
            sStack_8a = auVar42._14_2_;
            auVar68._0_2_ = -(ushort)(auVar43._0_2_ == local_98);
            auVar68._2_2_ = -(ushort)(auVar43._2_2_ == sStack_96);
            auVar68._4_2_ = -(ushort)(auVar43._4_2_ == sStack_94);
            auVar68._6_2_ = -(ushort)(auVar43._6_2_ == sStack_92);
            auVar68._8_2_ = -(ushort)(auVar43._8_2_ == sStack_90);
            auVar68._10_2_ = -(ushort)(auVar43._10_2_ == sStack_8e);
            auVar68._12_2_ = -(ushort)(auVar43._12_2_ == sStack_8c);
            auVar68._14_2_ = -(ushort)(auVar43._14_2_ == sStack_8a);
            auVar71._4_2_ = local_1b8;
            auVar71._0_4_ = uVar63;
            auVar71._6_2_ = sStack_1b6;
            auVar71._8_2_ = local_1b8;
            auVar71._10_2_ = sStack_1b6;
            auVar71._12_2_ = local_1b8;
            auVar71._14_2_ = sStack_1b6;
            uVar27 = 0;
            auVar69 = _DAT_00904d00;
            auVar66 = auVar71;
            do {
              auVar40._14_2_ = (short)piVar2[(long)(int)(uVar26 * iVar17) + (long)ptr[uVar27 + 7]];
              auVar40._12_2_ = (short)piVar2[(long)(int)(uVar20 * iVar17) + (long)ptr[uVar27 + 6]];
              auVar40._10_2_ = (short)piVar2[(long)(int)(uVar16 * iVar17) + (long)ptr[uVar27 + 5]];
              auVar40._8_2_ = (short)piVar2[(long)(int)(uVar30 * iVar17) + (long)ptr[uVar27 + 4]];
              auVar40._6_2_ = (short)piVar2[(long)(int)(uVar29 * iVar17) + (long)ptr[uVar27 + 3]];
              auVar40._4_2_ = (short)piVar2[(long)(int)(uVar33 * iVar17) + (long)ptr[uVar27 + 2]];
              auVar40._0_2_ = (undefined2)piVar2[(long)(int)(uVar15 * iVar17) + (long)ptr[uVar27]];
              auVar40._2_2_ = (short)piVar2[(long)(int)(uVar31 * iVar17) + (long)ptr[uVar27 + 1]];
              auVar40 = paddsw(auVar40,auVar65);
              auVar65._0_8_ = auVar67._2_8_;
              auVar65._8_8_ = auVar67._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar27 + 7] << 0x30;
              auVar73._0_8_ = auVar66._2_8_;
              auVar73._8_8_ = auVar66._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar27 + 7] << 0x30;
              auVar66._4_4_ = uVar35;
              auVar66._0_4_ = uVar35;
              auVar66._8_4_ = uVar35;
              auVar66._12_4_ = uVar35;
              auVar44 = psubsw(auVar65,auVar66);
              auVar74 = psubsw(auVar73,auVar38);
              sVar4 = auVar44._0_2_;
              sVar70 = auVar74._0_2_;
              auVar75._0_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar44._2_2_;
              sVar70 = auVar74._2_2_;
              auVar75._2_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar44._4_2_;
              sVar70 = auVar74._4_2_;
              auVar75._4_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar44._6_2_;
              sVar70 = auVar74._6_2_;
              auVar75._6_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar44._8_2_;
              sVar70 = auVar74._8_2_;
              auVar75._8_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar44._10_2_;
              sVar70 = auVar74._10_2_;
              auVar75._10_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70
              ;
              sVar4 = auVar44._12_2_;
              sVar70 = auVar74._12_2_;
              sVar72 = auVar74._14_2_;
              auVar75._12_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70
              ;
              sVar4 = auVar44._14_2_;
              auVar75._14_2_ = (ushort)(sVar72 < sVar4) * sVar4 | (ushort)(sVar72 >= sVar4) * sVar72
              ;
              auVar66 = psubsw(auVar67,auVar66);
              auVar71 = psubsw(auVar71,auVar38);
              sVar4 = auVar66._0_2_;
              sVar70 = auVar71._0_2_;
              auVar74._0_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar66._2_2_;
              sVar70 = auVar71._2_2_;
              auVar74._2_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar66._4_2_;
              sVar70 = auVar71._4_2_;
              auVar74._4_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar66._6_2_;
              sVar70 = auVar71._6_2_;
              auVar74._6_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar66._8_2_;
              sVar70 = auVar71._8_2_;
              auVar74._8_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
              sVar4 = auVar66._10_2_;
              sVar70 = auVar71._10_2_;
              auVar74._10_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70
              ;
              sVar4 = auVar66._12_2_;
              sVar70 = auVar71._12_2_;
              sVar72 = auVar71._14_2_;
              auVar74._12_2_ = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70
              ;
              sVar4 = auVar66._14_2_;
              auVar74._14_2_ = (ushort)(sVar72 < sVar4) * sVar4 | (ushort)(sVar72 >= sVar4) * sVar72
              ;
              uVar41 = ((short)auVar74._0_2_ < (short)auVar75._0_2_) * auVar75._0_2_ |
                       ((short)auVar74._0_2_ >= (short)auVar75._0_2_) * auVar74._0_2_;
              uVar47 = ((short)auVar74._2_2_ < (short)auVar75._2_2_) * auVar75._2_2_ |
                       ((short)auVar74._2_2_ >= (short)auVar75._2_2_) * auVar74._2_2_;
              uVar48 = ((short)auVar74._4_2_ < (short)auVar75._4_2_) * auVar75._4_2_ |
                       ((short)auVar74._4_2_ >= (short)auVar75._4_2_) * auVar74._4_2_;
              uVar49 = ((short)auVar74._6_2_ < (short)auVar75._6_2_) * auVar75._6_2_ |
                       ((short)auVar74._6_2_ >= (short)auVar75._6_2_) * auVar74._6_2_;
              uVar50 = ((short)auVar74._8_2_ < (short)auVar75._8_2_) * auVar75._8_2_ |
                       ((short)auVar74._8_2_ >= (short)auVar75._8_2_) * auVar74._8_2_;
              uVar51 = ((short)auVar74._10_2_ < (short)auVar75._10_2_) * auVar75._10_2_ |
                       ((short)auVar74._10_2_ >= (short)auVar75._10_2_) * auVar74._10_2_;
              uVar52 = ((short)auVar74._12_2_ < (short)auVar75._12_2_) * auVar75._12_2_ |
                       ((short)auVar74._12_2_ >= (short)auVar75._12_2_) * auVar74._12_2_;
              uVar53 = ((short)auVar74._14_2_ < (short)auVar75._14_2_) * auVar75._14_2_ |
                       ((short)auVar74._14_2_ >= (short)auVar75._14_2_) * auVar74._14_2_;
              sVar4 = auVar40._0_2_;
              auVar44._0_2_ =
                   (ushort)((short)uVar41 < sVar4) * sVar4 | ((short)uVar41 >= sVar4) * uVar41;
              sVar4 = auVar40._2_2_;
              auVar44._2_2_ =
                   (ushort)((short)uVar47 < sVar4) * sVar4 | ((short)uVar47 >= sVar4) * uVar47;
              sVar4 = auVar40._4_2_;
              auVar44._4_2_ =
                   (ushort)((short)uVar48 < sVar4) * sVar4 | ((short)uVar48 >= sVar4) * uVar48;
              sVar4 = auVar40._6_2_;
              auVar44._6_2_ =
                   (ushort)((short)uVar49 < sVar4) * sVar4 | ((short)uVar49 >= sVar4) * uVar49;
              sVar4 = auVar40._8_2_;
              auVar44._8_2_ =
                   (ushort)((short)uVar50 < sVar4) * sVar4 | ((short)uVar50 >= sVar4) * uVar50;
              sVar4 = auVar40._10_2_;
              auVar44._10_2_ =
                   (ushort)((short)uVar51 < sVar4) * sVar4 | ((short)uVar51 >= sVar4) * uVar51;
              sVar4 = auVar40._12_2_;
              auVar44._12_2_ =
                   (ushort)((short)uVar52 < sVar4) * sVar4 | ((short)uVar52 >= sVar4) * uVar52;
              sVar4 = auVar40._14_2_;
              auVar44._14_2_ =
                   (ushort)((short)uVar53 < sVar4) * sVar4 | ((short)uVar53 >= sVar4) * uVar53;
              auVar76._0_2_ = -(ushort)(auVar69._0_2_ == -1);
              auVar76._2_2_ = -(ushort)(auVar69._2_2_ == -1);
              auVar76._4_2_ = -(ushort)(auVar69._4_2_ == -1);
              auVar76._6_2_ = -(ushort)(auVar69._6_2_ == -1);
              auVar76._8_2_ = -(ushort)(auVar69._8_2_ == -1);
              auVar76._10_2_ = -(ushort)(auVar69._10_2_ == -1);
              auVar76._12_2_ = -(ushort)(auVar69._12_2_ == -1);
              auVar76._14_2_ = -(ushort)(auVar69._14_2_ == -1);
              auVar67 = local_178 & auVar76 | ~auVar76 & auVar44;
              sVar4 = auVar67._0_2_;
              sVar70 = auVar67._2_2_;
              sVar72 = auVar67._4_2_;
              sVar5 = auVar67._6_2_;
              sVar6 = auVar67._8_2_;
              sVar7 = auVar67._10_2_;
              sVar8 = auVar67._12_2_;
              sVar9 = auVar67._14_2_;
              if (7 < uVar27) {
                uVar55 = (ushort)(sVar4 < (short)uVar55) * sVar4 | (sVar4 >= (short)uVar55) * uVar55
                ;
                uVar56 = (ushort)(sVar70 < (short)uVar56) * sVar70 |
                         (sVar70 >= (short)uVar56) * uVar56;
                uVar57 = (ushort)(sVar72 < (short)uVar57) * sVar72 |
                         (sVar72 >= (short)uVar57) * uVar57;
                uVar58 = (ushort)(sVar5 < (short)uVar58) * sVar5 | (sVar5 >= (short)uVar58) * uVar58
                ;
                uVar59 = (ushort)(sVar6 < (short)uVar59) * sVar6 | (sVar6 >= (short)uVar59) * uVar59
                ;
                uVar60 = (ushort)(sVar7 < (short)uVar60) * sVar7 | (sVar7 >= (short)uVar60) * uVar60
                ;
                uVar61 = (ushort)(sVar8 < (short)uVar61) * sVar8 | (sVar8 >= (short)uVar61) * uVar61
                ;
                uVar62 = (ushort)(sVar9 < (short)uVar62) * sVar9 | (sVar9 >= (short)uVar62) * uVar62
                ;
                local_118._2_2_ =
                     (ushort)((short)local_118._2_2_ < sVar70) * sVar70 |
                     (ushort)((short)local_118._2_2_ >= sVar70) * local_118._2_2_;
                local_118._0_2_ =
                     (ushort)((short)local_118._0_2_ < sVar4) * sVar4 |
                     (ushort)((short)local_118._0_2_ >= sVar4) * local_118._0_2_;
                local_118._4_2_ =
                     (ushort)((short)local_118._4_2_ < sVar72) * sVar72 |
                     (ushort)((short)local_118._4_2_ >= sVar72) * local_118._4_2_;
                local_118._6_2_ =
                     (ushort)((short)local_118._6_2_ < sVar5) * sVar5 |
                     (ushort)((short)local_118._6_2_ >= sVar5) * local_118._6_2_;
                local_118._8_2_ =
                     (ushort)((short)local_118._8_2_ < sVar6) * sVar6 |
                     (ushort)((short)local_118._8_2_ >= sVar6) * local_118._8_2_;
                local_118._10_2_ =
                     (ushort)((short)local_118._10_2_ < sVar7) * sVar7 |
                     (ushort)((short)local_118._10_2_ >= sVar7) * local_118._10_2_;
                local_118._12_2_ =
                     (ushort)((short)local_118._12_2_ < sVar8) * sVar8 |
                     (ushort)((short)local_118._12_2_ >= sVar8) * local_118._12_2_;
                local_118._14_2_ =
                     (ushort)((short)local_118._14_2_ < sVar9) * sVar9 |
                     (ushort)((short)local_118._14_2_ >= sVar9) * local_118._14_2_;
              }
              piVar3 = ((ppVar18->field_4).rowcols)->score_row;
              if (uVar27 < uVar34) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_138) = (int)sVar9;
              }
              if (uVar27 - 1 < uVar34 && (uVar32 | 1) < uVar25) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_130) = (int)sVar8;
              }
              if (((uVar32 | 2) < uVar25) && ((long)(uVar27 - 2) < (long)uVar34 && 1 < uVar27)) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_150) = (int)sVar7;
              }
              if (((uVar32 | 3) < uVar25) && ((long)(uVar27 - 3) < (long)uVar34 && 2 < uVar27)) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_160) = (int)sVar6;
              }
              if (((uVar32 | 4) < uVar25) && ((long)(uVar27 - 4) < (long)uVar34 && 3 < uVar27)) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_158) = (int)sVar5;
              }
              if (((uVar32 | 5) < uVar25) && ((long)(uVar27 - 5) < (long)uVar34 && 4 < uVar27)) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_148) = (int)sVar72;
              }
              if (((uVar32 | 6) < uVar25) && ((long)(uVar27 - 6) < (long)uVar34 && 5 < uVar27)) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_140) = (int)sVar70;
              }
              if (6 < uVar27 && (uVar32 | 7) < uVar25) {
                *(int *)((long)piVar3 + uVar27 * 4 + local_128) = (int)sVar4;
              }
              auVar13._4_2_ = local_1b8;
              auVar13._0_4_ = uVar63;
              auVar13._6_2_ = sStack_1b6;
              auVar13._8_2_ = local_1b8;
              auVar13._10_2_ = sStack_1b6;
              auVar13._12_2_ = local_1b8;
              auVar13._14_2_ = sStack_1b6;
              auVar66 = ~auVar76 & auVar75 | auVar13 & auVar76;
              auVar71 = ~auVar76 & auVar74 | auVar13 & auVar76;
              ptr_00[uVar27] = sVar4;
              ptr_01[uVar27] = auVar66._0_2_;
              local_68 = auVar39._0_2_;
              sStack_66 = auVar39._2_2_;
              sStack_64 = auVar39._4_2_;
              sStack_62 = auVar39._6_2_;
              sStack_60 = auVar39._8_2_;
              sStack_5e = auVar39._10_2_;
              sStack_5c = auVar39._12_2_;
              sStack_5a = auVar39._14_2_;
              auVar45._0_2_ = -(ushort)(auVar69._0_2_ == local_68);
              auVar45._2_2_ = -(ushort)(auVar69._2_2_ == sStack_66);
              auVar45._4_2_ = -(ushort)(auVar69._4_2_ == sStack_64);
              auVar45._6_2_ = -(ushort)(auVar69._6_2_ == sStack_62);
              auVar45._8_2_ = -(ushort)(auVar69._8_2_ == sStack_60);
              auVar45._10_2_ = -(ushort)(auVar69._10_2_ == sStack_5e);
              auVar45._12_2_ = -(ushort)(auVar69._12_2_ == sStack_5c);
              auVar45._14_2_ = -(ushort)(auVar69._14_2_ == sStack_5a);
              auVar37 = ~(auVar45 & auVar68) & auVar37 | auVar67 & auVar45 & auVar68;
              auVar69 = paddsw(auVar69,_DAT_00904d10);
              uVar27 = uVar27 + 1;
            } while (uVar22 != uVar27);
            auVar43 = paddsw(auVar43,_DAT_00904d20);
            local_178 = psubsw(local_178,auVar64);
            local_128 = local_128 + lVar19;
            local_138 = local_138 + lVar19;
            local_130 = local_130 + lVar19;
            local_140 = local_140 + lVar19;
            local_148 = local_148 + lVar19;
            local_158 = local_158 + lVar19;
            local_160 = local_160 + lVar19;
            local_150 = local_150 + lVar19;
            uVar32 = uVar1;
          } while (uVar1 < uVar25);
        }
        iVar17 = 8;
        do {
          uVar22 = auVar37._0_8_;
          lVar19 = auVar37._8_8_;
          uVar26 = (uint)auVar37._14_2_;
          if ((short)auVar37._14_2_ <= (short)uVar28) {
            uVar26 = uVar28;
          }
          uVar28 = uVar26;
          sVar54 = (short)uVar28;
          auVar37._0_8_ = uVar22 << 0x10;
          auVar37._8_8_ = lVar19 << 0x10 | uVar22 >> 0x30;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
        auVar69._0_2_ = -(ushort)((short)uVar55 < local_1b8);
        auVar69._2_2_ = -(ushort)((short)uVar56 < sStack_1b6);
        auVar69._4_2_ = -(ushort)((short)uVar57 < local_1b8);
        auVar69._6_2_ = -(ushort)((short)uVar58 < sStack_1b6);
        auVar69._8_2_ = -(ushort)((short)uVar59 < local_1b8);
        auVar69._10_2_ = -(ushort)((short)uVar60 < sStack_1b6);
        auVar69._12_2_ = -(ushort)((short)uVar61 < local_1b8);
        auVar69._14_2_ = -(ushort)((short)uVar62 < sStack_1b6);
        auVar46._0_2_ = -(ushort)((short)local_108 < (short)local_118._0_2_);
        auVar46._2_2_ = -(ushort)((short)uStack_106 < (short)local_118._2_2_);
        auVar46._4_2_ = -(ushort)((short)local_108 < (short)local_118._4_2_);
        auVar46._6_2_ = -(ushort)((short)uStack_106 < (short)local_118._6_2_);
        auVar46._8_2_ = -(ushort)((short)local_108 < (short)local_118._8_2_);
        auVar46._10_2_ = -(ushort)((short)uStack_106 < (short)local_118._10_2_);
        auVar46._12_2_ = -(ushort)((short)local_108 < (short)local_118._12_2_);
        auVar46._14_2_ = -(ushort)((short)uStack_106 < (short)local_118._14_2_);
        auVar46 = auVar46 | auVar69;
        if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
          sVar54 = 0;
          iVar21 = 0;
          local_1d0 = 0;
        }
        ppVar18->score = (int)sVar54;
        ppVar18->end_query = local_1d0;
        ppVar18->end_ref = iVar21;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar18;
        }
        return ppVar18;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}